

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::AVisitor<hiberlite::UpdateBean>::startWalk<Person>
          (AVisitor<hiberlite::UpdateBean> *this,Person *obj,bean_key *key)

{
  allocator local_129;
  string local_128 [48];
  string local_f8 [32];
  Scope local_d8;
  string local_90 [8];
  string ClassName;
  stack<hiberlite::Scope,std::deque<hiberlite::Scope,std::allocator<hiberlite::Scope>>>
  local_70 [80];
  bean_key *local_20;
  bean_key *key_local;
  Person *obj_local;
  AVisitor<hiberlite::UpdateBean> *this_local;
  
  local_20 = key;
  key_local = (bean_key *)obj;
  obj_local = (Person *)this;
  bean_key::operator=(&this->rootKey,key);
  std::stack<hiberlite::Scope,std::deque<hiberlite::Scope,std::allocator<hiberlite::Scope>>>::
  stack<std::deque<hiberlite::Scope,std::allocator<hiberlite::Scope>>,void>(local_70);
  std::stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>::
  operator=(&this->stack,
            (stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>
             *)local_70);
  std::stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>::
  ~stack((stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>
          *)local_70);
  Database::getClassName<Person>();
  std::__cxx11::string::string(local_f8,local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"",&local_129);
  Scope::Scope(&local_d8,(string *)local_f8,(string *)local_128);
  Scope::operator=(&this->scope,&local_d8);
  Scope::~Scope(&local_d8);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string(local_f8);
  UpdateBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::UpdateBean>>(this->actor,this);
  walk<Person>(this,(Person *)key_local);
  UpdateBean::notifyDoneWalk<hiberlite::AVisitor<hiberlite::UpdateBean>>(this->actor,this);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

void AVisitor<C>::startWalk(Y& obj, bean_key key)
{
	rootKey=key;
	stack=std::stack<Scope>();
	std::string ClassName=Database::getClassName<Y>();
	scope=Scope(ClassName,"");

	actor->notifyInitWalk(*this);
		walk(obj);
	actor->notifyDoneWalk(*this);
}